

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O1

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine2_Test *this)

{
  iuCodeMessage *msg;
  ScopedMessage scoped_message_4;
  ScopedMessage scoped_message_3;
  int in_stack_fffffffffffffddc;
  iuCodeMessage local_220;
  iuCodeMessage local_1f0;
  ScopedMessage local_1c0;
  undefined1 local_190 [392];
  
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  iutest::detail::iuStreamMessage::operator<<
            ((iuStreamMessage *)local_190,(char (*) [10])"routine2.");
  std::__cxx11::stringbuf::str();
  local_220.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  local_220.m_line = 0x87;
  iutest::AssertionHelper::ScopedMessage::ScopedMessage(&local_1c0,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.m_message._M_dataplus._M_p != &local_220.m_message.field_2) {
    operator_delete(local_220.m_message._M_dataplus._M_p,
                    local_220.m_message.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  iutest::detail::iuStreamMessage::operator<<
            ((iuStreamMessage *)local_190,(char (*) [10])"routine2.");
  std::__cxx11::stringbuf::str();
  local_1f0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp";
  local_1f0.m_line = 0x89;
  msg = iutest::detail::iuCodeMessage::operator<<(&local_1f0,(char (*) [15])"iutest can do.");
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)&local_220,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  Sub2(in_stack_fffffffffffffddc);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)&local_220);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage(&local_1c0);
  Sub2(in_stack_fffffffffffffddc);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine2)
{
    {
        IUTEST_SCOPED_TRACE("routine2.");
#if !defined(IUTEST_USE_GTEST)
        IUTEST_SCOPED_TRACE("routine2.") << "iutest can do.";
#endif

        Sub2(2);
    }
    // ここの失敗には "routine2." のメッセージは表示されません。
    Sub2(3);
}